

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnEventType(BinaryReaderIR *this,Index index,Index sig_index)

{
  Event *pEVar1;
  pointer *__ptr;
  _Head_base<0UL,_wabt::EventModuleField_*,_false> local_a8;
  EventModuleField *local_a0;
  Location local_98;
  Var local_78;
  
  GetLocation(&local_98,this);
  MakeUnique<wabt::EventModuleField,wabt::Location>((wabt *)&local_a0,&local_98);
  pEVar1 = &local_a0->event;
  GetLocation(&local_98,this);
  Var::Var(&local_78,sig_index,&local_98);
  SetFuncDeclaration(this,&pEVar1->decl,&local_78);
  Var::~Var(&local_78);
  local_a8._M_head_impl = local_a0;
  local_a0 = (EventModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>
                       *)&local_a8);
  if (local_a8._M_head_impl != (EventModuleField *)0x0) {
    (*((local_a8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField
      ._vptr_ModuleField[1])();
  }
  local_a8._M_head_impl = (EventModuleField *)0x0;
  if (local_a0 != (EventModuleField *)0x0) {
    (**(code **)(*(long *)local_a0 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnEventType(Index index, Index sig_index) {
  auto field = MakeUnique<EventModuleField>(GetLocation());
  Event& event = field->event;
  SetFuncDeclaration(&event.decl, Var(sig_index, GetLocation()));
  module_->AppendField(std::move(field));
  return Result::Ok;
}